

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool cmQtAutoGenerator::FileRead(string *content,string *filename,string *error)

{
  bool bVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  ifstream ifs;
  byte abStack_208 [200];
  undefined8 auStack_140 [36];
  
  content->_M_string_length = 0;
  *(content->_M_dataplus)._M_p = '\0';
  bVar1 = cmsys::SystemTools::FileExists(filename,true);
  if (!bVar1) {
    if (error != (string *)0x0) {
      std::__cxx11::string::assign((char *)error);
    }
    return false;
  }
  cmsys::SystemTools::FileLength(filename);
  std::ifstream::ifstream(&ifs,(filename->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((abStack_208[*(long *)(_ifs + -0x18)] & 5) == 0) {
    std::__cxx11::string::reserve((ulong)content);
    __first._8_8_ = 0xffffffffffffffff;
    __first._M_sbuf = *(streambuf_type **)((long)auStack_140 + *(long *)(_ifs + -0x18));
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)content,__first,
               (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
    if ((abStack_208[*(long *)(_ifs + -0x18)] & 5) == 0) {
      bVar1 = true;
      goto LAB_0017d446;
    }
    content->_M_string_length = 0;
    *(content->_M_dataplus)._M_p = '\0';
  }
  if (error != (string *)0x0) {
    std::__cxx11::string::assign((char *)error);
  }
  bVar1 = false;
LAB_0017d446:
  std::ifstream::~ifstream(&ifs);
  return bVar1;
}

Assistant:

bool cmQtAutoGenerator::FileRead(std::string& content,
                                 std::string const& filename,
                                 std::string* error)
{
  content.clear();
  if (!cmSystemTools::FileExists(filename, true)) {
    if (error != nullptr) {
      *error = "Not a file.";
    }
    return false;
  }

  unsigned long const length = cmSystemTools::FileLength(filename);
  cmsys::ifstream ifs(filename.c_str(), (std::ios::in | std::ios::binary));

  // Use lambda to save destructor calls of ifs
  return [&ifs, length, &content, error]() -> bool {
    if (!ifs) {
      if (error != nullptr) {
        *error = "Opening the file for reading failed.";
      }
      return false;
    }
    content.reserve(length);
    typedef std::istreambuf_iterator<char> IsIt;
    content.assign(IsIt{ ifs }, IsIt{});
    if (!ifs) {
      content.clear();
      if (error != nullptr) {
        *error = "Reading from the file failed.";
      }
      return false;
    }
    return true;
  }();
}